

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O3

Id dxil_spv::build_lod_from_gradient(Impl *impl,Id grad_x,Id grad_y)

{
  Id IVar1;
  Id IVar2;
  Builder *this;
  Operation *pOVar3;
  Operation *pOVar4;
  Operation *this_00;
  
  this = Converter::Impl::builder(impl);
  IVar1 = spv::Builder::makeFloatType(this,0x20);
  if (impl->glsl_std450_ext == 0) {
    IVar2 = spv::Builder::import(this,"GLSL.std.450");
    impl->glsl_std450_ext = IVar2;
  }
  pOVar3 = Converter::Impl::allocate(impl,OpDot,IVar1);
  Operation::add_id(pOVar3,grad_x);
  Operation::add_id(pOVar3,grad_x);
  Converter::Impl::add(impl,pOVar3,false);
  pOVar4 = Converter::Impl::allocate(impl,OpDot,IVar1);
  Operation::add_id(pOVar4,grad_y);
  Operation::add_id(pOVar4,grad_y);
  Converter::Impl::add(impl,pOVar4,false);
  this_00 = Converter::Impl::allocate(impl,OpExtInst,IVar1);
  Operation::add_id(this_00,impl->glsl_std450_ext);
  Operation::add_literal(this_00,0x28);
  Operation::add_id(this_00,pOVar3->id);
  Operation::add_id(this_00,pOVar4->id);
  Converter::Impl::add(impl,this_00,false);
  pOVar3 = Converter::Impl::allocate(impl,OpExtInst,IVar1);
  Operation::add_id(pOVar3,impl->glsl_std450_ext);
  Operation::add_literal(pOVar3,0x1e);
  Operation::add_id(pOVar3,this_00->id);
  Converter::Impl::add(impl,pOVar3,false);
  pOVar4 = Converter::Impl::allocate(impl,OpFMul,IVar1);
  Operation::add_id(pOVar4,pOVar3->id);
  IVar1 = spv::Builder::makeFloatConstant(this,0.5,false);
  Operation::add_id(pOVar4,IVar1);
  Converter::Impl::add(impl,pOVar4,false);
  return pOVar4->id;
}

Assistant:

static spv::Id build_lod_from_gradient(Converter::Impl &impl, spv::Id grad_x, spv::Id grad_y)
{
	auto &builder = impl.builder();
	spv::Id f32_type = builder.makeFloatType(32);

	if (!impl.glsl_std450_ext)
		impl.glsl_std450_ext = builder.import("GLSL.std.450");

	auto *dot_x = impl.allocate(spv::OpDot, f32_type);
	dot_x->add_id(grad_x);
	dot_x->add_id(grad_x);
	impl.add(dot_x);

	auto *dot_y = impl.allocate(spv::OpDot, f32_type);
	dot_y->add_id(grad_y);
	dot_y->add_id(grad_y);
	impl.add(dot_y);

	auto *dot_max = impl.allocate(spv::OpExtInst, f32_type);
	dot_max->add_id(impl.glsl_std450_ext);
	dot_max->add_literal(GLSLstd450FMax);
	dot_max->add_id(dot_x->id);
	dot_max->add_id(dot_y->id);
	impl.add(dot_max);

	auto *log_op = impl.allocate(spv::OpExtInst, f32_type);
	log_op->add_id(impl.glsl_std450_ext);
	log_op->add_literal(GLSLstd450Log2);
	log_op->add_id(dot_max->id);
	impl.add(log_op);

	auto *half_mul = impl.allocate(spv::OpFMul, f32_type);
	half_mul->add_id(log_op->id);
	half_mul->add_id(builder.makeFloatConstant(0.5f));
	impl.add(half_mul);

	return half_mul->id;
}